

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O0

void __thiscall
Assimp::IFC::Schema_2x3::IfcFlowTreatmentDeviceType::~IfcFlowTreatmentDeviceType
          (IfcFlowTreatmentDeviceType *this,void **vtt)

{
  void **vtt_local;
  IfcFlowTreatmentDeviceType *this_local;
  
  STEP::ObjectHelper<Assimp::IFC::Schema_2x3::IfcFlowTreatmentDeviceType,_0UL>::~ObjectHelper
            ((ObjectHelper<Assimp::IFC::Schema_2x3::IfcFlowTreatmentDeviceType,_0UL> *)
             &(this->super_IfcDistributionFlowElementType).super_IfcDistributionElementType.
              field_0x1a0,vtt + 0x32);
  IfcDistributionFlowElementType::~IfcDistributionFlowElementType
            (&this->super_IfcDistributionFlowElementType,vtt + 1);
  return;
}

Assistant:

IfcFlowTreatmentDeviceType() : Object("IfcFlowTreatmentDeviceType") {}